

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double units::getNumberBlock(string *ustring,size_t *index)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  double __value;
  string local_a8;
  double local_88;
  double pval;
  size_t nindex;
  size_t local_70;
  size_t ind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> substr;
  ulong uStack_40;
  value_type c;
  size_t ii;
  size_t sStack_30;
  bool hasOp;
  size_t ival;
  double val;
  size_t *index_local;
  string *ustring_local;
  
  ival = 0x7ff4000000000000;
  val = (double)index;
  index_local = (size_t *)ustring;
  pcVar5 = (char *)std::__cxx11::string::front();
  if (*pcVar5 == '(') {
    sStack_30 = 1;
    bVar2 = segmentcheck((string *)index_local,')',&stack0xffffffffffffffd0);
    if (!bVar2) {
      return NAN;
    }
    if (sStack_30 == 2) {
      *(undefined8 *)val = 2;
      return 1.0;
    }
    bVar2 = false;
    for (uStack_40 = 1; uStack_40 < sStack_30 - 1; uStack_40 = uStack_40 + 1) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)index_local);
      substr.field_2._M_local_buf[0xf] = *pcVar5;
      if ((substr.field_2._M_local_buf[0xf] < '0') || ('9' < substr.field_2._M_local_buf[0xf])) {
        iVar3 = (int)substr.field_2._M_local_buf[0xf];
        if (iVar3 - 0x28U < 3) {
LAB_001b992e:
          bVar2 = true;
        }
        else if (1 < iVar3 - 0x2dU) {
          if ((iVar3 == 0x2f) || (iVar3 == 0x5e)) goto LAB_001b992e;
          if (iVar3 != 0x65) {
            return NAN;
          }
        }
      }
    }
    std::__cxx11::string::substr((ulong)&ind,(ulong)index_local);
    local_70 = 0;
    if (bVar2) {
      ival = (size_t)generateLeadingNumber((string *)&ind,&local_70);
    }
    else {
      ival = (size_t)getDoubleFromString((string *)&ind,&local_70);
    }
    sVar1 = local_70;
    uVar6 = std::__cxx11::string::size();
    if (uVar6 <= sVar1) {
      *(size_t *)val = sStack_30;
    }
    else {
      ustring_local = (string *)0x7ff4000000000000;
    }
    nindex._4_4_ = (uint)(uVar6 > sVar1);
    std::__cxx11::string::~string((string *)&ind);
    if (nindex._4_4_ != 0) {
      return (double)ustring_local;
    }
  }
  else {
    ival = (size_t)getDoubleFromString((string *)index_local,(size_t *)val);
  }
  uVar4 = std::isnan((double)ival);
  if ((((uVar4 & 1) == 0) &&
      (uVar6 = *(ulong *)val, uVar7 = std::__cxx11::string::size(), uVar6 < uVar7)) &&
     (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)index_local), *pcVar5 == '^')) {
    pval = 0.0;
    std::__cxx11::string::substr((ulong)&local_a8,(ulong)index_local);
    __value = getNumberBlock(&local_a8,(size_t *)&pval);
    std::__cxx11::string::~string((string *)&local_a8);
    local_88 = __value;
    uVar4 = std::isnan(__value);
    if ((uVar4 & 1) == 0) {
      *(long *)val = (long)pval + 1 + *(long *)val;
      ustring_local = (string *)::pow((double)ival,local_88);
    }
    else {
      *(undefined8 *)val = 0;
      ustring_local = (string *)0x7ff4000000000000;
    }
  }
  else {
    ustring_local = (string *)ival;
  }
  return (double)ustring_local;
}

Assistant:

static double getNumberBlock(const std::string& ustring, size_t& index) noexcept
{
    double val{constants::invalid_conversion};
    if (ustring.front() == '(') {
        size_t ival{1};
        if (segmentcheck(ustring, ')', ival)) {
            if (ival == 2) {
                index = ival;
                return 1.0;
            }
            bool hasOp = false;
            for (size_t ii = 1; ii < ival - 1; ++ii) {
                auto c = ustring[ii];
                if (c >= '0' && c <= '9') {
                    continue;
                }
                switch (c) {
                    case '-':
                    case '.':
                    case 'e':
                        break;
                    case '*':
                    case '/':
                    case '^':
                    case '(':
                    case ')':
                        hasOp = true;
                        break;
                    default:
                        return constants::invalid_conversion;
                }
            }
            auto substr = ustring.substr(1, ival - 2);
            size_t ind{0};
            if (hasOp) {
                val = generateLeadingNumber(substr, ind);
            } else {
                val = getDoubleFromString(substr, &ind);
            }
            if (ind < substr.size()) {
                return constants::invalid_conversion;
            }
            index = ival;
        } else {
            return constants::invalid_conversion;
        }
    } else {
        val = getDoubleFromString(ustring, &index);
    }
    if (!std::isnan(val) && index < ustring.size()) {
        if (ustring[index] == '^') {
            size_t nindex{0};
            double pval = getNumberBlock(ustring.substr(index + 1), nindex);
            if (!std::isnan(pval)) {
                index += nindex + 1;
                return std::pow(val, pval);
            }
            index = 0;
            return constants::invalid_conversion;
        }
    }
    return val;
}